

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreateAddressResponse::CreateAddressResponse(CreateAddressResponse *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  CreateAddressResponse *local_10;
  CreateAddressResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::CreateAddressResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreateAddressResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::CreateAddressResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateAddressResponse_01b3bae0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->address_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->locking_script_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  CollectFieldName();
  return;
}

Assistant:

CreateAddressResponse() {
    CollectFieldName();
  }